

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O3

void Js::ByteCodeDumper::
     DumpElementU<Js::OpLayoutT_ElementU<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
               (OpCode op,OpLayoutT_ElementU<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  code *pcVar1;
  bool bVar2;
  PropertyId propertyId;
  ScriptContext *this;
  PropertyRecord *pPVar3;
  undefined4 *puVar4;
  ulong uVar5;
  undefined6 in_register_0000003a;
  char16_t *form;
  int iVar6;
  
  this = FunctionProxy::GetScriptContext((FunctionProxy *)dumpFunction);
  propertyId = FunctionBody::GetReferencedPropertyId(dumpFunction,(uint)data->PropertyIdIndex);
  pPVar3 = ScriptContext::GetPropertyName(this,propertyId);
  iVar6 = (int)CONCAT62(in_register_0000003a,op);
  if (iVar6 < 0x12f) {
    if (iVar6 != 0xbe) {
      if (iVar6 == 0xc3) {
        Output::Print(L" %s = R%d",pPVar3 + 1,(ulong)data->Instance);
        return;
      }
LAB_007f5401:
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                  ,0x26c,"(false)","Unknown OpCode for ElementU");
      if (bVar2) {
        *puVar4 = 0;
        return;
      }
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    uVar5 = (ulong)data->Instance;
    form = L" R%d.%s = undefined";
  }
  else if (iVar6 - 0x12fU < 2) {
    uVar5 = (ulong)data->Instance;
    form = L" R%d = %s ";
  }
  else {
    if (iVar6 != 0x17b) goto LAB_007f5401;
    uVar5 = (ulong)data->Instance;
    form = L" R%d.%s.writable/enumerable/configurable = 0";
  }
  Output::Print(form,uVar5,pPVar3 + 1);
  return;
}

Assistant:

void ByteCodeDumper::DumpElementU(OpCode op, const unaligned T * data, Js::FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        ScriptContext* scriptContext = dumpFunction->GetScriptContext();
        PropertyRecord const * pPropertyName = scriptContext->GetPropertyName(
            dumpFunction->GetReferencedPropertyId(data->PropertyIdIndex));
        switch (op)
        {
            case OpCode::LdElemUndef:
            {
                Output::Print(_u(" R%d.%s = undefined"), data->Instance, pPropertyName->GetBuffer());
                break;
            }
            // TODO: Change InitUndeclLetFld and InitUndeclConstFld to ElementU layout
            // case OpCode::InitUndeclLetFld:
            // case OpCode::InitUndeclConstFld:
            // {
            //     PropertyRecord const * pPropertyName = scriptContext->GetPropertyName(data->PropertyIndex);
            //     Output::Print(_u(" R%d.%s"), data->Instance, pPropertyName->GetBuffer());
            //     break;
            // }
            case OpCode::ClearAttributes:
            {
                Output::Print(_u(" R%d.%s.writable/enumerable/configurable = 0"), data->Instance, pPropertyName->GetBuffer());
                break;
            }

            case OpCode::DeleteLocalFld:
            case OpCode::DeleteLocalFld_ReuseLoc:
                Output::Print(_u(" R%d = %s "), data->Instance, pPropertyName->GetBuffer());
                break;

            case OpCode::StLocalFuncExpr:
                Output::Print(_u(" %s = R%d"), pPropertyName->GetBuffer(), data->Instance);
                break;

            default:
            {
                AssertMsg(false, "Unknown OpCode for ElementU");
                break;
            }
        }
    }